

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AddressFilter.cpp
# Opt level: O1

bool AddressFilter::AddressText(uint8_t *addr,size_t len,char *text,size_t text_max)

{
  char *pcVar1;
  int __af;
  
  if (len == 4) {
    __af = 2;
  }
  else {
    if (len != 0x10) {
      return false;
    }
    __af = 10;
  }
  pcVar1 = inet_ntop(__af,addr,text,(socklen_t)text_max);
  return pcVar1 != (char *)0x0;
}

Assistant:

bool AddressFilter::AddressText(uint8_t * addr, size_t len, char * text, size_t text_max)
{
    bool ret = true;

    if (len == 4)
    {
        if (inet_ntop(AF_INET, addr, text, text_max) == NULL)
        {
            ret = false;
        }
    }
    else if (len == 16)
    {
        if (inet_ntop(AF_INET6, addr, text, text_max) == NULL)
        {
            ret = false;
        }
    }
    else
    {
        ret = false;
    }

    return ret;
}